

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

TrackPosition * __thiscall mkvparser::CuePoint::Find(CuePoint *this,Track *pTrack)

{
  TrackPosition *pTVar1;
  TrackPosition *pTVar2;
  TrackPosition *pTVar3;
  long lVar4;
  
  if (pTrack != (Track *)0x0) {
    lVar4 = this->m_track_positions_count * 0x18;
    pTVar3 = this->m_track_positions + -1;
    while (lVar4 != 0) {
      pTVar1 = pTVar3 + 1;
      lVar4 = lVar4 + -0x18;
      pTVar2 = pTVar3 + 1;
      pTVar3 = pTVar1;
      if (pTVar2->m_track == (pTrack->m_info).number) {
        return pTVar1;
      }
    }
  }
  return (TrackPosition *)0x0;
}

Assistant:

const CuePoint::TrackPosition* CuePoint::Find(const Track* pTrack) const {
  if (pTrack == NULL) {
    return NULL;
  }

  const long long n = pTrack->GetNumber();

  const TrackPosition* i = m_track_positions;
  const TrackPosition* const j = i + m_track_positions_count;

  while (i != j) {
    const TrackPosition& p = *i++;

    if (p.m_track == n)
      return &p;
  }

  return NULL;  // no matching track number found
}